

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::FboCases::RepeatedClearCase::render
          (RepeatedClearCase *this,Context *ctx,Surface *dst)

{
  uint uVar1;
  uint uVar2;
  deUint32 program;
  FboConfig *pFVar3;
  FboIncompleteException *this_00;
  Vector<float,_3> local_1f8;
  Vector<float,_3> local_1ec;
  float local_1e0;
  float local_1dc;
  float a;
  float b;
  float g;
  float r;
  int cellX;
  int cellY;
  GLenum status;
  int fboNdx;
  deUint32 textures [2];
  deUint32 fbos [2];
  Random rnd;
  undefined1 local_188 [4];
  deUint32 fboBlitShaderID;
  SingleTex2DShader fboBlitShader;
  int fboSizes [2];
  int cellSize;
  int numRowsCols;
  Surface *dst_local;
  Context *ctx_local;
  RepeatedClearCase *this_local;
  
  fboBlitShader.super_ShaderProgram.m_hasGeometryShader = true;
  fboBlitShader.super_ShaderProgram._337_7_ = 0x40000000;
  SingleTex2DShader::SingleTex2DShader((SingleTex2DShader *)local_188);
  program = (*ctx->_vptr_Context[0x75])(ctx,(SingleTex2DShader *)local_188);
  de::Random::Random((Random *)(fbos + 1),0x1153f3e);
  textures[0] = 0;
  textures[1] = 0;
  _status = 0;
  (*ctx->_vptr_Context[10])(ctx,2,textures);
  (*ctx->_vptr_Context[7])(ctx,2,&status);
  cellY = 0;
  while( true ) {
    if (1 < cellY) {
      (*ctx->_vptr_Context[0x2a])(0,0,0);
      (*ctx->_vptr_Context[0x2d])(ctx,0x4000);
      SingleTex2DShader::setUnit((SingleTex2DShader *)local_188,ctx,program,0);
      (*ctx->_vptr_Context[6])(ctx,0xde1,_status & 0xffffffff);
      for (r = 0.0; (int)r < 4; r = (float)((int)r + 1)) {
        for (g = 0.0; (int)g < 4; g = (float)((int)g + 1)) {
          b = de::Random::getFloat((Random *)(fbos + 1));
          a = de::Random::getFloat((Random *)(fbos + 1));
          local_1dc = de::Random::getFloat((Random *)(fbos + 1));
          local_1e0 = de::Random::getFloat((Random *)(fbos + 1));
          (*ctx->_vptr_Context[9])(ctx,0x8d40,(ulong)textures & 0xffffffff);
          (*ctx->_vptr_Context[0x2a])(b,a,local_1dc,local_1e0);
          (*ctx->_vptr_Context[0x2d])(ctx,0x4000);
          (*ctx->_vptr_Context[9])(ctx,0x8d40,(ulong)textures >> 0x20);
          (*ctx->_vptr_Context[5])(ctx,(ulong)(uint)((int)g << 4),(ulong)(uint)((int)r << 4),0x10);
          tcu::Vector<float,_3>::Vector(&local_1ec,-1.0,-1.0,0.0);
          tcu::Vector<float,_3>::Vector(&local_1f8,1.0,1.0,0.0);
          sglr::drawQuad(ctx,program,&local_1ec,&local_1f8);
        }
      }
      (*ctx->_vptr_Context[0x80])
                (ctx,dst,0,0,(ulong)fboBlitShader.super_ShaderProgram._336_8_ >> 0x20);
      de::Random::~Random((Random *)(fbos + 1));
      SingleTex2DShader::~SingleTex2DShader((SingleTex2DShader *)local_188);
      return;
    }
    (*ctx->_vptr_Context[6])(ctx,0xde1,(ulong)(&status)[cellY]);
    pFVar3 = FboRenderCase::getConfig(&this->super_FboRenderCase);
    uVar1 = pFVar3->colorbufferFormat;
    uVar2 = fboSizes[(long)cellY + -2];
    pFVar3 = FboRenderCase::getConfig(&this->super_FboRenderCase);
    (*ctx->_vptr_Context[0x11])
              (ctx,0xde1,0,(ulong)uVar1,(ulong)uVar2,(ulong)uVar2,0,pFVar3->colorbufferFormat,0x1401
               ,0);
    (*ctx->_vptr_Context[0x1d])(ctx,0xde1,0x2802,0x812f);
    (*ctx->_vptr_Context[0x1d])(ctx,0xde1,0x2803,0x812f);
    (*ctx->_vptr_Context[0x1d])(ctx,0xde1,0x2801,0x2600);
    (*ctx->_vptr_Context[0x1d])(ctx,0xde1,0x2800,0x2600);
    (*ctx->_vptr_Context[9])(ctx,0x8d40,(ulong)textures[cellY]);
    (*ctx->_vptr_Context[0x1e])(ctx,0x8d40,0x8ce0,0xde1,(ulong)(&status)[cellY],0);
    cellX = (*ctx->_vptr_Context[0x21])(ctx,0x8d40);
    if (cellX != 0x8cd5) break;
    cellY = cellY + 1;
    cellX = 0x8cd5;
  }
  this_00 = (FboIncompleteException *)__cxa_allocate_exception(0x50);
  pFVar3 = FboRenderCase::getConfig(&this->super_FboRenderCase);
  FboIncompleteException::FboIncompleteException
            (this_00,pFVar3,cellX,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fFboRenderTest.cpp"
             ,0x7ea);
  __cxa_throw(this_00,&FboIncompleteException::typeinfo,
              FboIncompleteException::~FboIncompleteException);
}

Assistant:

void render (sglr::Context& ctx, Surface& dst)
	{
		const int						numRowsCols		= 4;
		const int						cellSize		= 16;
		const int						fboSizes[]		= { cellSize, cellSize*numRowsCols };

		SingleTex2DShader				fboBlitShader;
		const deUint32					fboBlitShaderID	= ctx.createProgram(&fboBlitShader);

		de::Random						rnd				(18169662);
		deUint32						fbos[]			= { 0, 0 };
		deUint32						textures[]		= { 0, 0 };

		ctx.genFramebuffers(2, &fbos[0]);
		ctx.genTextures(2, &textures[0]);

		for (int fboNdx = 0; fboNdx < DE_LENGTH_OF_ARRAY(fbos); fboNdx++)
		{
			ctx.bindTexture(GL_TEXTURE_2D, textures[fboNdx]);
			ctx.texImage2D(GL_TEXTURE_2D, 0, getConfig().colorbufferFormat, fboSizes[fboNdx], fboSizes[fboNdx], 0,
						   getConfig().colorbufferFormat, GL_UNSIGNED_BYTE, DE_NULL);
			ctx.texParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
			ctx.texParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
			ctx.texParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MIN_FILTER,	GL_NEAREST);
			ctx.texParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MAG_FILTER,	GL_NEAREST);

			ctx.bindFramebuffer(GL_FRAMEBUFFER, fbos[fboNdx]);
			ctx.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, textures[fboNdx], 0);

			{
				const GLenum status = ctx.checkFramebufferStatus(GL_FRAMEBUFFER);
				if (status != GL_FRAMEBUFFER_COMPLETE)
					throw FboIncompleteException(getConfig(), status, __FILE__, __LINE__);
			}
		}

		// larger fbo bound -- clear to transparent black
		ctx.clearColor(0.0f, 0.0f, 0.0f, 0.0f);
		ctx.clear(GL_COLOR_BUFFER_BIT);

		fboBlitShader.setUnit(ctx, fboBlitShaderID, 0);
		ctx.bindTexture(GL_TEXTURE_2D, textures[0]);

		for (int cellY = 0; cellY < numRowsCols; cellY++)
		for (int cellX = 0; cellX < numRowsCols; cellX++)
		{
			const float	r	= rnd.getFloat();
			const float	g	= rnd.getFloat();
			const float	b	= rnd.getFloat();
			const float	a	= rnd.getFloat();

			ctx.bindFramebuffer(GL_FRAMEBUFFER, fbos[0]);
			ctx.clearColor(r, g, b, a);
			ctx.clear(GL_COLOR_BUFFER_BIT);

			ctx.bindFramebuffer(GL_FRAMEBUFFER, fbos[1]);
			ctx.viewport(cellX*cellSize, cellY*cellSize, cellSize, cellSize);
			sglr::drawQuad(ctx, fboBlitShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		}

		ctx.readPixels(dst, 0, 0, fboSizes[1], fboSizes[1]);
	}